

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

int VP8ProcessRow(VP8Decoder *dec,VP8Io *io)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  WebPWorkerInterface *pWVar4;
  void *in_RSI;
  long in_RDI;
  VP8FInfo *tmp_1;
  VP8MBData *tmp;
  WebPWorker *worker;
  void *in_stack_00000020;
  int filter_row;
  VP8ThreadContext *ctx;
  int ok;
  bool local_41;
  uint local_14;
  
  local_41 = false;
  if ((0 < *(int *)(in_RDI + 0xb68)) &&
     (local_41 = false, *(int *)(in_RDI + 0x1a4) <= *(int *)(in_RDI + 0xb5c))) {
    local_41 = *(int *)(in_RDI + 0xb5c) <= *(int *)(in_RDI + 0x1ac);
  }
  uVar2 = (uint)local_41;
  if (*(int *)(in_RDI + 200) == 0) {
    *(undefined4 *)(in_RDI + 0xdc) = *(undefined4 *)(in_RDI + 0xb5c);
    *(uint *)(in_RDI + 0xe0) = uVar2;
    ReconstructRow(dec,(VP8ThreadContext *)io);
    local_14 = FinishRow(ctx,in_stack_00000020);
  }
  else {
    pWVar4 = WebPGetWorkerInterface();
    local_14 = (*pWVar4->Sync)((WebPWorker *)(in_RDI + 0x98));
    local_14 = local_14 & 1;
    if (local_14 != 0) {
      memcpy((void *)(in_RDI + 0xf8),in_RSI,0xa0);
      *(undefined4 *)(in_RDI + 0xd8) = *(undefined4 *)(in_RDI + 0xcc);
      *(undefined4 *)(in_RDI + 0xdc) = *(undefined4 *)(in_RDI + 0xb5c);
      *(uint *)(in_RDI + 0xe0) = uVar2;
      if (*(int *)(in_RDI + 200) == 2) {
        uVar1 = *(undefined8 *)(in_RDI + 0xf0);
        *(undefined8 *)(in_RDI + 0xf0) = *(undefined8 *)(in_RDI + 0xb60);
        *(undefined8 *)(in_RDI + 0xb60) = uVar1;
      }
      else {
        ReconstructRow(dec,(VP8ThreadContext *)io);
      }
      if (uVar2 != 0) {
        uVar1 = *(undefined8 *)(in_RDI + 0xe8);
        *(undefined8 *)(in_RDI + 0xe8) = *(undefined8 *)(in_RDI + 0xb18);
        *(undefined8 *)(in_RDI + 0xb18) = uVar1;
      }
      pWVar4 = WebPGetWorkerInterface();
      (*pWVar4->Launch)((WebPWorker *)(in_RDI + 0x98));
      iVar3 = *(int *)(in_RDI + 0xcc) + 1;
      *(int *)(in_RDI + 0xcc) = iVar3;
      if (iVar3 == *(int *)(in_RDI + 0xd0)) {
        *(undefined4 *)(in_RDI + 0xcc) = 0;
      }
    }
  }
  return local_14;
}

Assistant:

int VP8ProcessRow(VP8Decoder* const dec, VP8Io* const io) {
  int ok = 1;
  VP8ThreadContext* const ctx = &dec->thread_ctx_;
  const int filter_row =
      (dec->filter_type_ > 0) &&
      (dec->mb_y_ >= dec->tl_mb_y_) && (dec->mb_y_ <= dec->br_mb_y_);
  if (dec->mt_method_ == 0) {
    // ctx->id_ and ctx->f_info_ are already set
    ctx->mb_y_ = dec->mb_y_;
    ctx->filter_row_ = filter_row;
    ReconstructRow(dec, ctx);
    ok = FinishRow(dec, io);
  } else {
    WebPWorker* const worker = &dec->worker_;
    // Finish previous job *before* updating context
    ok &= WebPGetWorkerInterface()->Sync(worker);
    assert(worker->status_ == OK);
    if (ok) {   // spawn a new deblocking/output job
      ctx->io_ = *io;
      ctx->id_ = dec->cache_id_;
      ctx->mb_y_ = dec->mb_y_;
      ctx->filter_row_ = filter_row;
      if (dec->mt_method_ == 2) {  // swap macroblock data
        VP8MBData* const tmp = ctx->mb_data_;
        ctx->mb_data_ = dec->mb_data_;
        dec->mb_data_ = tmp;
      } else {
        // perform reconstruction directly in main thread
        ReconstructRow(dec, ctx);
      }
      if (filter_row) {            // swap filter info
        VP8FInfo* const tmp = ctx->f_info_;
        ctx->f_info_ = dec->f_info_;
        dec->f_info_ = tmp;
      }
      // (reconstruct)+filter in parallel
      WebPGetWorkerInterface()->Launch(worker);
      if (++dec->cache_id_ == dec->num_caches_) {
        dec->cache_id_ = 0;
      }
    }
  }
  return ok;
}